

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packetinfo.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  runtime_error *this;
  int *in_R9;
  char local_5bc [4];
  ifstream f;
  byte abStack_598 [488];
  array<unsigned_char,_892UL> buf;
  
  std::ifstream::ifstream(&f,argv[1],_S_in);
  if (*(int *)(abStack_598 + *(long *)(_f + -0x18)) == 0) {
    while( true ) {
      std::istream::read((char *)&f,(long)&buf);
      if ((abStack_598[*(long *)(_f + -0x18)] & 2) != 0) break;
      poVar1 = std::operator<<((ostream *)&std::cout,"SCID: ");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar1,
                          (uint)(byte)(buf._M_elems[0] << 2 | buf._M_elems[1] >> 6));
      poVar1 = std::operator<<(poVar1,", VCID: ");
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,buf._M_elems[1] & 0x3f);
      poVar1 = std::operator<<(poVar1,", counter: ");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar1,
                          (uint)buf._M_elems[4] |
                          (uint)buf._M_elems[3] << 8 | (uint)buf._M_elems[2] << 0x10);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    std::ifstream::~ifstream(&f);
    return 0;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_5bc[0] = '\v';
  local_5bc[1] = '\0';
  local_5bc[2] = '\0';
  local_5bc[3] = '\0';
  util::str<char[32],char[101],char[2],int>
            ((string *)&buf,(util *)"Assertion `f.good()` failed at ",
             (char (*) [32])
             "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/assembler/packetinfo.cc"
             ,(char (*) [101])":",(char (*) [2])local_5bc,in_R9);
  std::runtime_error::runtime_error(this,(string *)&buf);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char** argv) {
  std::ifstream f(argv[1]);
  ASSERT(f.good());

  std::array<uint8_t, 892> buf;
  for (;;) {
    f.read((char*) buf.data(), buf.size());
    if (f.eof()) {
      break;
    }

    VCDU vcdu(buf);
    std::cout
      << "SCID: " << vcdu.getSCID()
      << ", VCID: " << vcdu.getVCID()
      << ", counter: " << vcdu.getCounter()
      << std::endl;
  }

  return 0;
}